

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sym_tbl.h
# Opt level: O2

string * __thiscall mocker::ScopeID::fmt_abi_cxx11_(string *__return_storage_ptr__,ScopeID *this)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar1 = (this->ids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar2 = (this->ids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    std::__cxx11::to_string(&local_70,*puVar2);
    std::operator+(&local_50,&local_70,"-");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::pop_back();
  return __return_storage_ptr__;
}

Assistant:

std::string fmt() const {
    std::string res;
    for (std::size_t id : ids)
      res += std::to_string(id) + "-";
    res.pop_back();
    return res;
  }